

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O3

String * __thiscall
asl::IniFile::operator[](String *__return_storage_ptr__,IniFile *this,String *name)

{
  int iVar1;
  int iVar2;
  Map<asl::String,_asl::String> *pMVar3;
  String *pSVar4;
  undefined8 b;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  String sec;
  String local_58;
  String local_40;
  
  iVar1 = String::indexOf(name,'/',0);
  if (iVar1 < 0) {
    pMVar3 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
              super_Map<asl::String,_asl::String>;
    iVar1 = Map<asl::String,_asl::String>::indexOf(pMVar3,name);
    if (-1 < iVar1) {
      pMVar3 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                          ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
                super_Map<asl::String,_asl::String>;
      pSVar4 = Map<asl::String,_asl::String>::operator[](pMVar3,name);
      iVar1 = pSVar4->_len;
      String::alloc(__return_storage_ptr__,iVar1);
      __return_storage_ptr__->_len = iVar1;
      if (__return_storage_ptr__->_size == 0) {
        paVar5 = &__return_storage_ptr__->field_2;
      }
      else {
        paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
      }
      if (pSVar4->_size == 0) {
        paVar6 = &pSVar4->field_2;
      }
      else {
        paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar4->field_2)._str;
      }
      memcpy(paVar5,paVar6,(long)iVar1 + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->field_2)._space[0] = '\0';
    __return_storage_ptr__->_size = 0;
    __return_storage_ptr__->_len = 0;
    return __return_storage_ptr__;
  }
  String::substring(&local_40,name,0,iVar1);
  iVar2 = Map<asl::String,_asl::Dic<asl::String>_>::indexOf
                    ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_40);
  if (-1 < iVar2) {
    pMVar3 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_40)->
              super_Map<asl::String,_asl::String>;
    String::substring(&local_58,name,iVar1 + 1,name->_len);
    b = local_58.field_2._str;
    if (local_58._size == 0) {
      b = &local_58.field_2;
    }
    String::assign(&local_40,(char *)b,local_58._len);
    if (local_58._size != 0) {
      free(local_58.field_2._str);
    }
    iVar1 = Map<asl::String,_asl::String>::indexOf(pMVar3,&local_40);
    if (-1 < iVar1) {
      pSVar4 = Map<asl::String,_asl::String>::operator[](pMVar3,&local_40);
      iVar1 = pSVar4->_len;
      String::alloc(__return_storage_ptr__,iVar1);
      __return_storage_ptr__->_len = iVar1;
      if (__return_storage_ptr__->_size == 0) {
        paVar5 = &__return_storage_ptr__->field_2;
      }
      else {
        paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
      }
      if (pSVar4->_size == 0) {
        paVar6 = &pSVar4->field_2;
      }
      else {
        paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar4->field_2)._str;
      }
      memcpy(paVar5,paVar6,(long)iVar1 + 1);
      goto LAB_00131101;
    }
  }
  (__return_storage_ptr__->field_2)._space[0] = '\0';
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_len = 0;
LAB_00131101:
  if (local_40._size != 0) {
    free(local_40.field_2._str);
  }
  return __return_storage_ptr__;
}

Assistant:

const String IniFile::operator[](const String& name) const
{
	int slash = name.indexOf('/');
	if (slash < 0)
	{
		return _sections[_currentTitle].has(name) ? _sections[_currentTitle][name] : String();
	}
	else
	{
		String sec = name.substring(0, slash);
		if (!_sections.has(sec))
			return String();
		const Section& section = _sections[sec];
		sec = name.substring(slash + 1);
		return section.has(sec) ? section[sec] : String();
	}
}